

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

void __thiscall clickhouse::ColumnDateTime::ColumnDateTime(ColumnDateTime *this,string *timezone)

{
  Type local_40;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)timezone);
  Type::CreateDateTime(&local_40,&local_30);
  Column::Column(&this->super_Column,(TypeRef *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40.field_1);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnDateTime_00185700;
  std::make_shared<clickhouse::ColumnVector<unsigned_int>>();
  return;
}

Assistant:

ColumnDateTime::ColumnDateTime(std::string timezone)
    : Column(Type::CreateDateTime(std::move(timezone)))
    , data_(std::make_shared<ColumnUInt32>())
{
}